

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::AssocArrayExistsMethod::~AssocArrayExistsMethod(AssocArrayExistsMethod *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~AssocArrayExistsMethod((AssocArrayExistsMethod *)0x8c5418);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

AssocArrayExistsMethod() :
        SystemSubroutine(KnownSystemName::Exists, SubroutineKind::Function) {}